

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::Service>
          (FlatBufferBuilderImpl<false> *this,Offset<reflection::Service> *v,size_t len)

{
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_> OVar1;
  TableKeyComparator<reflection::Service> local_30;
  size_t local_28;
  size_t len_local;
  Offset<reflection::Service> *v_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_28 = len;
  len_local = (size_t)v;
  v_local = (Offset<reflection::Service> *)this;
  TableKeyComparator<reflection::Service>::TableKeyComparator(&local_30,&this->buf_);
  std::
  stable_sort<flatbuffers::Offset<reflection::Service>*,flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<reflection::Service>>
            (v,v + len,&local_30);
  OVar1 = CreateVector<reflection::Service>(this,(Offset<reflection::Service> *)len_local,local_28);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_>)
         OVar1.o;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVectorOfSortedTables(Offset<T> *v,
                                                       size_t len) {
    std::stable_sort(v, v + len, TableKeyComparator<T>(buf_));
    return CreateVector(v, len);
  }